

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

void __thiscall
chaiscript::exception::file_not_found_error::file_not_found_error
          (file_not_found_error *this,string *t_filename)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *t_filename_local;
  file_not_found_error *this_local;
  
  local_18 = t_filename;
  t_filename_local = (string *)this;
  std::operator+(&local_38,"File Not Found: ",t_filename);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)this = &PTR__file_not_found_error_0082ccb8;
  std::__cxx11::string::string((string *)&this->filename,local_18);
  return;
}

Assistant:

explicit file_not_found_error(const std::string &t_filename)
          : std::runtime_error("File Not Found: " + t_filename)
          , filename(t_filename) {
      }